

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

bool __thiscall
wallet::anon_unknown_5::WalletImpl::getPubKey
          (WalletImpl *this,CScript *script,CKeyID *address,CPubKey *pub_key)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  pointer pSVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  CScript *in_RSI;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> provider;
  __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffbc;
  bool local_11;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            (in_stack_ffffffffffffffa8);
  CWallet::GetSolvingProvider(in_RDI,in_RSI);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> *)
                     in_stack_ffffffffffffffa8);
  if (bVar2) {
    pSVar4 = _GLOBAL__N_1::std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>::
             operator->((unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> *)
                        in_stack_ffffffffffffffa8);
    iVar3 = (*pSVar4->_vptr_SigningProvider[4])(pSVar4,in_RDX,in_RCX);
    local_11 = (bool)((byte)iVar3 & 1);
  }
  else {
    local_11 = false;
  }
  std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>::~unique_ptr
            ((unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> *)
             CONCAT44(in_stack_ffffffffffffffbc,1));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool getPubKey(const CScript& script, const CKeyID& address, CPubKey& pub_key) override
    {
        std::unique_ptr<SigningProvider> provider = m_wallet->GetSolvingProvider(script);
        if (provider) {
            return provider->GetPubKey(address, pub_key);
        }
        return false;
    }